

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,deUint32 _attachmentCount,
          VkPipelineColorBlendAttachmentState *_attachments,VkBool32 _logicOpEnable,
          VkLogicOp _logicOp)

{
  size_type sVar1;
  reference pvVar2;
  allocator<vk::VkPipelineColorBlendAttachmentState> local_29;
  VkLogicOp local_28;
  VkBool32 local_24;
  VkLogicOp _logicOp_local;
  VkBool32 _logicOpEnable_local;
  VkPipelineColorBlendAttachmentState *_attachments_local;
  ColorBlendState *pCStack_10;
  deUint32 _attachmentCount_local;
  ColorBlendState *this_local;
  
  local_28 = _logicOp;
  local_24 = _logicOpEnable;
  __logicOp_local = _attachments;
  _attachments_local._4_4_ = _attachmentCount;
  pCStack_10 = this;
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::allocator(&local_29);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,_attachments,_attachments + _attachmentCount,&local_29);
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::~allocator(&local_29);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags = 0;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable = local_24;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp = local_28;
  sVar1 = std::
          vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
          ::size(&this->m_attachments);
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount = (deUint32)sVar1;
  pvVar2 = std::
           vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ::operator[](&this->m_attachments,0);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pvVar2;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (deUint32											_attachmentCount,
													  const vk::VkPipelineColorBlendAttachmentState*	_attachments,
													  vk::VkBool32										_logicOpEnable,
													  vk::VkLogicOp										_logicOp)
	: m_attachments(_attachments, _attachments + _attachmentCount)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
	pNext	= DE_NULL;
	flags					= 0;
	logicOpEnable			= _logicOpEnable;
	logicOp					= _logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
}